

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

word Acb_ComputeFunction(sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,int fCompl)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int *begin;
  int *end;
  ulong local_d8;
  int local_70;
  int local_6c;
  int pLits [2];
  int *pFinal;
  int nFinal;
  int iLit;
  int iVar;
  int i;
  int status;
  Vec_Int_t *vTempLits;
  word uTruth;
  word uCube;
  int fExpand;
  int fCompl_local;
  Vec_Int_t *vDivVars_local;
  int FreeVar_local;
  int PivotVar_local;
  sat_solver *pSat_local;
  
  vTempLits = (Vec_Int_t *)0x0;
  p = Vec_IntAlloc(100);
  iVar1 = sat_solver_nvars(pSat);
  if (iVar1 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x161,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
  }
  local_70 = Abc_Var2Lit(PivotVar,fCompl);
  local_6c = Abc_Var2Lit(FreeVar,0);
  do {
    iVar1 = sat_solver_solve(pSat,&local_70,pLits,0,0,0,0);
    if (iVar1 == -1) {
      Vec_IntFree(p);
      return (word)vTempLits;
    }
    if (iVar1 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x170,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
    }
    iVar1 = Abc_LitNot(local_6c);
    Vec_IntFill(p,1,iVar1);
    for (iLit = 0; iVar1 = Vec_IntSize(vDivVars), iLit < iVar1; iLit = iLit + 1) {
      iVar1 = Vec_IntEntry(vDivVars,iLit);
      iVar1 = sat_solver_var_literal(pSat,iVar1);
      iVar1 = Abc_LitNot(iVar1);
      Vec_IntPush(p,iVar1);
    }
    uTruth = 0xffffffffffffffff;
    for (iLit = 1; iVar1 = Vec_IntSize(p), iLit < iVar1; iLit = iLit + 1) {
      iVar1 = Vec_IntEntry(p,iLit);
      iVar2 = Abc_Lit2Var(iVar1);
      iVar2 = Vec_IntFind(vDivVars,iVar2);
      if (iVar2 < 0) {
        __assert_fail("iVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x18d,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
      }
      iVar1 = Abc_LitIsCompl(iVar1);
      if (iVar1 == 0) {
        local_d8 = s_Truths6[iVar2] ^ 0xffffffffffffffff;
      }
      else {
        local_d8 = s_Truths6[iVar2];
      }
      uTruth = local_d8 & uTruth;
    }
    vTempLits = (Vec_Int_t *)(uTruth | (ulong)vTempLits);
    begin = Vec_IntArray(p);
    end = Vec_IntLimit(p);
    iVar1 = sat_solver_addclause(pSat,begin,end);
  } while (iVar1 != 0);
  Vec_IntFree(p);
  return (word)vTempLits;
}

Assistant:

word Acb_ComputeFunction( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, int fCompl )
{
    int fExpand = 0;
    word uCube, uTruth = 0;
    Vec_Int_t * vTempLits = Vec_IntAlloc( 100 );
    int status, i, iVar, iLit, nFinal, * pFinal, pLits[2];
    assert( FreeVar < sat_solver_nvars(pSat) );
//    if ( fCompl )
//        pLits[0] = Abc_Var2Lit( sat_solver_nvars(pSat)-2, 0 ); // F = 1
//    else
        pLits[0] = Abc_Var2Lit( PivotVar, fCompl ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
        assert( status == l_True );
        if ( fExpand )
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[0]) ); // F = 0
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            // check against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check during function comptutation.\n" );
            assert( status == l_False );
            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
                if ( pFinal[i] != pLits[0] )
                    Vec_IntPush( vTempLits, pFinal[i] );
        }
        else
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) );// NOT(iNewLit)
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, Abc_LitNot(sat_solver_var_literal(pSat, iVar)) );
        }
        uCube = ~(word)0;
        Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
        {
            iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(iLit) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        if ( status == 0 )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
    }
    Vec_IntFree( vTempLits );
    assert( 0 ); 
    return ~(word)0;
}